

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O0

bool __thiscall JsonModelSerialiser::saveModel(JsonModelSerialiser *this,QString *destination)

{
  byte bVar1;
  QByteArray local_78;
  QString local_60;
  undefined4 local_48;
  QJsonObject local_38 [8];
  QJsonDocument local_30 [8];
  QJsonDocument jDoc;
  JsonModelSerialiserPrivate *d;
  QString *destination_local;
  JsonModelSerialiser *this_local;
  
  if (destination == (QString *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    _jDoc = d_func(this);
    if ((_jDoc->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
        m_constModel == (QAbstractItemModel *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      (**(code **)(*(long *)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser +
                  0xd0))();
      QJsonDocument::QJsonDocument(local_30,local_38);
      QJsonObject::~QJsonObject(local_38);
      bVar1 = QJsonDocument::isNull();
      this_local._7_1_ = (bVar1 & 1) == 0;
      if (this_local._7_1_) {
        QJsonDocument::toJson((JsonFormat)&local_78);
        QString::fromUtf8<void>(&local_60,&local_78);
        QString::operator=(destination,&local_60);
        QString::~QString(&local_60);
        QByteArray::~QByteArray(&local_78);
      }
      local_48 = 1;
      QJsonDocument::~QJsonDocument(local_30);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool JsonModelSerialiser::saveModel(QString *destination) const
{
    if (!destination)
        return false;
    Q_D(const JsonModelSerialiser);
    if (!d->m_constModel)
        return false;
    const QJsonDocument jDoc(toJsonObject());
    if (jDoc.isNull())
        return false;
    *destination = QString::fromUtf8(jDoc.toJson(d->m_format));
    return true;
}